

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_scope_t * ztast_scope(ztast_t *ast,ztast_statement_t *stmt)

{
  ztast_statement *in_RSI;
  long in_RDI;
  ztast_scope_t *scope;
  ztast_scope_t *local_8;
  
  local_8 = (ztast_scope_t *)(**(code **)(in_RDI + 8))(8,*(undefined8 *)(in_RDI + 0x18));
  if (local_8 == (ztast_scope_t *)0x0) {
    local_8 = (ztast_scope_t *)0x0;
  }
  else {
    local_8->statements = in_RSI;
  }
  return local_8;
}

Assistant:

ztast_scope_t *ztast_scope(ztast_t *ast, ztast_statement_t *stmt)
{
  ztast_scope_t *scope;

  assert(ast);
  /* statement may be NULL */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_scope\n");
#endif

  scope = ZTAST_MALLOC(sizeof(*scope));
  if (scope == NULL)
    return NULL;

  scope->statements = stmt;

  return scope;
}